

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::
vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::push_back(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_t sVar4;
  pointer pcVar5;
  undefined8 uVar6;
  size_t sVar7;
  
  sVar4 = this->nAlloc;
  sVar7 = this->nStored;
  if (sVar4 == sVar7) {
    sVar7 = 4;
    if (sVar4 != 0) {
      sVar7 = sVar4 * 2;
    }
    reserve(this,sVar7);
    sVar7 = this->nStored;
  }
  pbVar2 = this->ptr + sVar7;
  paVar3 = &this->ptr[sVar7].field_2;
  paVar1 = &value->field_2;
  (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar3 + -1))->_M_dataplus
  )._M_p = (pointer)paVar3;
  pcVar5 = (value->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar1) {
    uVar6 = *(undefined8 *)((long)&value->field_2 + 8);
    paVar3->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)paVar3 + 8) = uVar6;
  }
  else {
    (pbVar2->_M_dataplus)._M_p = pcVar5;
    (pbVar2->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  pbVar2->_M_string_length = value->_M_string_length;
  (value->_M_dataplus)._M_p = (pointer)paVar1;
  value->_M_string_length = 0;
  (value->field_2)._M_local_buf[0] = '\0';
  this->nStored = this->nStored + 1;
  return;
}

Assistant:

void push_back(T &&value) {
        if (nAlloc == nStored)
            reserve(nAlloc == 0 ? 4 : 2 * nAlloc);

        alloc.construct(ptr + nStored, std::move(value));
        ++nStored;
    }